

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_d8;
  int exitCode;
  int i;
  int startArgumentIndex;
  sysbvm_contextCreationOptions_t contextOptions;
  char **argv_local;
  int argc_local;
  
  contextOptions._176_8_ = argv;
  memset(&i,0,0xb8);
  exitCode = 1;
  if ((argc < 3) ||
     (iVar1 = strcmp(*(char **)(contextOptions._176_8_ + 8),"-load-image"), iVar1 != 0)) {
    for (local_d8 = 1; local_d8 < argc; local_d8 = local_d8 + 1) {
      iVar1 = strcmp(*(char **)(contextOptions._176_8_ + (long)local_d8 * 8),"-m32");
      if (iVar1 == 0) {
        i = 4;
      }
      else {
        iVar1 = strcmp(*(char **)(contextOptions._176_8_ + (long)local_d8 * 8),"-m64");
        if (iVar1 == 0) {
          i = 8;
        }
        else {
          iVar1 = strcmp(*(char **)(contextOptions._176_8_ + (long)local_d8 * 8),"-nojit");
          if (iVar1 == 0) {
            contextOptions.targetExceptionHandlingTableFormatName._0_1_ = 1;
          }
          else {
            iVar1 = strcmp(*(char **)(contextOptions._176_8_ + (long)local_d8 * 8),"-nogc");
            if (iVar1 == 0) {
              contextOptions.targetExceptionHandlingTableFormatName._4_4_ = 3;
            }
            else {
              iVar1 = strcmp(*(char **)(contextOptions._176_8_ + (long)local_d8 * 8),"-moving-gc");
              if (iVar1 == 0) {
                contextOptions.targetExceptionHandlingTableFormatName._4_4_ = 1;
              }
              else {
                iVar1 = strcmp(*(char **)(contextOptions._176_8_ + (long)local_d8 * 8),
                               "-non-moving-gc");
                if (iVar1 == 0) {
                  contextOptions.targetExceptionHandlingTableFormatName._4_4_ = 2;
                }
              }
            }
          }
        }
      }
    }
    context = sysbvm_context_createWithOptions((sysbvm_contextCreationOptions_t *)&i);
  }
  else {
    context = sysbvm_context_loadImageFromFileNamed(*(char **)(contextOptions._176_8_ + 0x10));
    exitCode = 3;
  }
  if (context == (sysbvm_context_t *)0x0) {
    fprintf(_stderr,"Failed to create sysbvm context.\n");
    argv_local._4_4_ = 1;
  }
  else {
    argv_local._4_4_ = mainWithContext(exitCode,argc,(char **)contextOptions._176_8_);
    if (destinationImageFilename != (char *)0x0) {
      sysbvm_context_saveImageToFileNamed(context,destinationImageFilename);
    }
    sysbvm_context_destroy(context);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
    sysbvm_contextCreationOptions_t contextOptions = {0};

    // Allow creating the context by loading it from an image.
    int startArgumentIndex = 1;
    if(argc >= 3 && !strcmp(argv[1], "-load-image"))
    {
        context = sysbvm_context_loadImageFromFileNamed(argv[2]);
        startArgumentIndex = 3;
    }
    else
    {
        for(int i = 1; i < argc; ++i)
        {
            if(!strcmp(argv[i], "-m32"))
                contextOptions.targetWordSize = 4;
            else if(!strcmp(argv[i], "-m64"))
                contextOptions.targetWordSize = 8;
            else if(!strcmp(argv[i], "-nojit"))
                contextOptions.nojit = true;
            else if(!strcmp(argv[i], "-nogc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_DISABLED;
            else if(!strcmp(argv[i], "-moving-gc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_MOVING;
            else if(!strcmp(argv[i], "-non-moving-gc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_NON_MOVING;
        }

        context = sysbvm_context_createWithOptions(&contextOptions);
    }

    if(!context)
    {
        fprintf(stderr, "Failed to create sysbvm context.\n");
        return 1;
    }

    int exitCode = mainWithContext(startArgumentIndex, argc, argv);

    // Allow saving the context as an image.
    if(destinationImageFilename)
        sysbvm_context_saveImageToFileNamed(context, destinationImageFilename);
    sysbvm_context_destroy(context);
    
    return exitCode;
}